

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcStatesPartialsFixedScaling
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,int *states1,double *matrices1,
          double *partials2,double *matrices2,double *scaleFactors,int startPattern,int endPattern)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int local_58;
  
  lVar5 = (long)(this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
  if (0 < lVar5) {
    local_58 = startPattern * 4;
    iVar2 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
    lVar7 = (long)startPattern;
    lVar10 = 0;
    do {
      if (startPattern < endPattern) {
        lVar8 = (long)local_58;
        iVar4 = (int)lVar10;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = matrices2[lVar10 * 0x14];
        auVar17._8_8_ = 0;
        auVar17._0_8_ = matrices2[lVar10 * 0x14 + 1];
        auVar18._8_8_ = 0;
        auVar18._0_8_ = matrices2[lVar10 * 0x14 + 2];
        auVar19._8_8_ = 0;
        auVar19._0_8_ = matrices2[lVar10 * 0x14 + 3];
        auVar20._8_8_ = 0;
        auVar20._0_8_ = matrices2[lVar10 * 0x14 + 5];
        auVar21._8_8_ = 0;
        auVar21._0_8_ = matrices2[lVar10 * 0x14 + 6];
        auVar22._8_8_ = 0;
        auVar22._0_8_ = matrices2[lVar10 * 0x14 + 7];
        auVar23._8_8_ = 0;
        auVar23._0_8_ = matrices2[lVar10 * 0x14 + 8];
        auVar24._8_8_ = 0;
        auVar24._0_8_ = matrices2[lVar10 * 0x14 + 10];
        auVar25._8_8_ = 0;
        auVar25._0_8_ = matrices2[lVar10 * 0x14 + 0xb];
        auVar26._8_8_ = 0;
        auVar26._0_8_ = matrices2[lVar10 * 0x14 + 0xc];
        auVar27._8_8_ = 0;
        auVar27._0_8_ = matrices2[lVar10 * 0x14 + 0xd];
        auVar28._8_8_ = 0;
        auVar28._0_8_ = matrices2[lVar10 * 0x14 + 0xf];
        auVar29._8_8_ = 0;
        auVar29._0_8_ = matrices2[lVar10 * 0x14 + 0x10];
        auVar30._8_8_ = 0;
        auVar30._0_8_ = matrices2[lVar10 * 0x14 + 0x11];
        auVar31._8_8_ = 0;
        auVar31._0_8_ = matrices2[lVar10 * 0x14 + 0x12];
        lVar6 = 0;
        lVar9 = endPattern - lVar7;
        do {
          iVar3 = *(int *)((long)states1 + lVar6 + lVar7 * 4);
          uVar1 = *(ulong *)((long)scaleFactors + lVar6 * 2 + lVar7 * 8);
          auVar35._8_8_ = 0;
          auVar35._0_8_ = partials2[lVar8 + lVar6 + 1];
          auVar11 = vmulsd_avx512f(auVar17,auVar35);
          auVar15._8_8_ = 0;
          auVar15._0_8_ = partials2[lVar8 + lVar6];
          auVar11 = vfmadd231sd_avx512f(auVar11,auVar16,auVar15);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = partials2[lVar8 + lVar6 + 2];
          auVar11 = vfmadd231sd_avx512f(auVar11,auVar18,auVar37);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = partials2[lVar8 + lVar6 + 3];
          auVar12 = vfmadd231sd_avx512f(auVar11,auVar19,auVar39);
          auVar11 = vmulsd_avx512f(auVar21,auVar35);
          auVar11 = vfmadd231sd_avx512f(auVar11,auVar20,auVar15);
          auVar11 = vfmadd231sd_avx512f(auVar11,auVar22,auVar37);
          auVar13 = vfmadd231sd_avx512f(auVar11,auVar23,auVar39);
          auVar36._8_8_ = 0;
          auVar36._0_8_ = partials2[lVar8 + lVar6 + 1];
          auVar11 = vmulsd_avx512f(auVar25,auVar36);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = partials2[lVar8 + lVar6];
          auVar11 = vfmadd231sd_avx512f(auVar11,auVar24,auVar34);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = partials2[lVar8 + lVar6 + 2];
          auVar11 = vfmadd231sd_avx512f(auVar11,auVar26,auVar38);
          auVar40._8_8_ = 0;
          auVar40._0_8_ = partials2[lVar8 + lVar6 + 3];
          auVar14 = vfmadd231sd_avx512f(auVar11,auVar27,auVar40);
          auVar11 = vmulsd_avx512f(auVar29,auVar36);
          auVar11 = vfmadd231sd_avx512f(auVar11,auVar28,auVar34);
          auVar11 = vfmadd231sd_avx512f(auVar11,auVar30,auVar38);
          auVar15 = vfmadd231sd_avx512f(auVar11,auVar31,auVar40);
          auVar11._8_8_ = 0;
          auVar11._0_8_ = matrices1[iVar3 + iVar4 * 0x14];
          auVar11 = vmulsd_avx512f(auVar12,auVar11);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar1;
          auVar11 = vdivsd_avx512f(auVar11,auVar32);
          vmovsd_avx512f(auVar11);
          destP[lVar8 + lVar6] = destP[lVar8 + lVar6];
          auVar12._8_8_ = 0;
          auVar12._0_8_ = matrices1[iVar3 + iVar4 * 0x14 + 5];
          auVar11 = vmulsd_avx512f(auVar13,auVar12);
          auVar11 = vdivsd_avx512f(auVar11,auVar32);
          vmovsd_avx512f(auVar11);
          destP[lVar8 + lVar6 + 1] = destP[lVar8 + lVar6 + 1];
          auVar13._8_8_ = 0;
          auVar13._0_8_ = matrices1[iVar3 + iVar4 * 0x14 + 10];
          auVar11 = vmulsd_avx512f(auVar14,auVar13);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = uVar1;
          auVar11 = vdivsd_avx512f(auVar11,auVar33);
          vmovsd_avx512f(auVar11);
          destP[lVar8 + lVar6 + 2] = destP[lVar8 + lVar6 + 2];
          auVar14._8_8_ = 0;
          auVar14._0_8_ = matrices1[iVar3 + iVar4 * 0x14 + 0xf];
          auVar11 = vmulsd_avx512f(auVar15,auVar14);
          auVar11 = vdivsd_avx512f(auVar11,auVar33);
          vmovsd_avx512f(auVar11);
          destP[lVar8 + lVar6 + 3] = destP[lVar8 + lVar6 + 3];
          lVar6 = lVar6 + 4;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      lVar10 = lVar10 + 1;
      local_58 = local_58 + iVar2 * 4;
    } while (lVar10 != lVar5);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcStatesPartialsFixedScaling(REALTYPE* destP,
                                                                             const int* states1,
                                                                             const REALTYPE* matrices1,
                                                                             const REALTYPE* partials2,
                                                                             const REALTYPE* matrices2,
                                                                             const REALTYPE* scaleFactors,
                                                                             int startPattern,
                                                                             int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          u += 4*startPattern;
        }

        int w = l*4*OFFSET;

        PREFETCH_MATRIX(2,matrices2,w);

        for (int k = startPattern; k < endPattern; k++) {

            const int state1 = states1[k];
            const REALTYPE scaleFactor = scaleFactors[k];

            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23

            destP[u    ] = matrices1[w            + state1] * sum20 / scaleFactor;
            destP[u + 1] = matrices1[w + OFFSET*1 + state1] * sum21 / scaleFactor;
            destP[u + 2] = matrices1[w + OFFSET*2 + state1] * sum22 / scaleFactor;
            destP[u + 3] = matrices1[w + OFFSET*3 + state1] * sum23 / scaleFactor;

            u += 4;
        }
    }
}